

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int ffrsim(fitsfile *fptr,int bitpix,int naxis,long *naxes,int *status)

{
  int local_34c;
  int ii;
  LONGLONG tnaxes [99];
  int *status_local;
  long *naxes_local;
  int naxis_local;
  int bitpix_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    tnaxes[0x62] = (LONGLONG)status;
    for (local_34c = 0; local_34c < naxis && local_34c < 99; local_34c = local_34c + 1) {
      tnaxes[(long)local_34c + -1] = naxes[local_34c];
    }
    ffrsimll(fptr,bitpix,naxis,(LONGLONG *)&stack0xfffffffffffffcb8,(int *)tnaxes[0x62]);
    fptr_local._4_4_ = *(int *)tnaxes[0x62];
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffrsim(fitsfile *fptr,      /* I - FITS file pointer           */
           int bitpix,          /* I - bits per pixel              */
           int naxis,           /* I - number of axes in the array */
           long *naxes,         /* I - size of each axis           */
           int *status)         /* IO - error status               */
/*
   resize an existing primary array or IMAGE extension.
*/
{
    LONGLONG tnaxes[99];
    int ii;
    
    if (*status > 0)
        return(*status);

    for (ii = 0; (ii < naxis) && (ii < 99); ii++)
        tnaxes[ii] = naxes[ii];

    ffrsimll(fptr, bitpix, naxis, tnaxes, status);

    return(*status);
}